

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqpvalue.c
# Opt level: O2

int amqpvalue_get_encoded_array_size(AMQP_VALUE *items,uint32_t count,uint32_t *encoded_size)

{
  int iVar1;
  uint uVar2;
  LOGGER_LOG p_Var3;
  char *pcVar4;
  ulong uVar5;
  size_t item_size;
  
  if (encoded_size == (uint32_t *)0x0) {
    p_Var3 = xlogging_get_log_function();
    iVar1 = 0x1067;
    if (p_Var3 != (LOGGER_LOG)0x0) {
      (*p_Var3)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
                ,"amqpvalue_get_encoded_array_size",0x1066,1,"Bad arguments: encoded_size = %p",0);
    }
  }
  else {
    *encoded_size = 0;
    uVar2 = 0;
    for (uVar5 = 0; count != uVar5; uVar5 = uVar5 + 1) {
      if (items[uVar5] == (AMQP_VALUE)0x0) {
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 != (LOGGER_LOG)0x0) {
          (*p_Var3)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
                    ,"amqpvalue_get_encoded_array_item_size",0x12b3,1,
                    "Bad arguments: item = %p, encoded_size = %p",0,&item_size);
        }
LAB_0010b828:
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 == (LOGGER_LOG)0x0) {
          return 0x1083;
        }
        pcVar4 = "Could not get encoded size for element %u of the array";
        iVar1 = 0x1073;
LAB_0010b859:
        (*p_Var3)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
                  ,"amqpvalue_get_encoded_array_size",iVar1,1,pcVar4);
        return 0x1083;
      }
      item_size = 0;
      iVar1 = amqpvalue_encode_array_item(items[uVar5],false,count_bytes,&item_size);
      if (iVar1 != 0) goto LAB_0010b828;
      if ((item_size >> 0x20 != 0) ||
         (uVar2 = (uint)item_size + *encoded_size, CARRY4((uint)item_size,*encoded_size))) {
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 == (LOGGER_LOG)0x0) {
          return 0x1083;
        }
        pcVar4 = "Overflow in array size computation";
        iVar1 = 0x107a;
        goto LAB_0010b859;
      }
      *encoded_size = uVar2;
    }
    iVar1 = 0;
    if (count < uVar2) {
      *encoded_size = uVar2 + 1;
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

static int amqpvalue_get_encoded_array_size(AMQP_VALUE* items, uint32_t count, uint32_t* encoded_size)
{
    size_t i;
    int result;

    if (encoded_size == NULL)
    {
        LogError("Bad arguments: encoded_size = %p", encoded_size);
        result = MU_FAILURE;
    }
    else
    {
        *encoded_size = 0;

        /* Get the size of all items in the array */
        for (i = 0; i < count; i++)
        {
            size_t item_size;
            if (amqpvalue_get_encoded_array_item_size(items[i], &item_size) != 0)
            {
                LogError("Could not get encoded size for element %u of the array", (unsigned int)i);
                break;
            }

            if ((item_size > UINT32_MAX) ||
                *encoded_size + (uint32_t)item_size < *encoded_size)
            {
                LogError("Overflow in array size computation");
                break;
            }

            *encoded_size = (uint32_t)(*encoded_size + item_size);
        }

        if (i < count)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (*encoded_size > count)
            {
                /* Include a single constructor byte in the size calculation where array items require a constructor. */
                (*encoded_size)++;
            }
            result = 0;
        }
    }
    return result;
}